

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O2

qreal __thiscall QSimplex::solver(QSimplex *this,SolverFactor factor)

{
  double dVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  double local_40;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  clearRow(this,0);
  local_30 = (piter)QHash<QSimplexVariable_*,_double>::cbegin(&this->objective->variables);
  local_40 = 0.0;
  while( true ) {
    if (local_30.d == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0 &&
        local_30.bucket == 0) break;
    pSVar3 = (local_30.d)->spans;
    uVar7 = local_30.bucket >> 7;
    pEVar4 = pSVar3[uVar7].entries;
    bVar2 = pSVar3[uVar7].offsets[(uint)local_30.bucket & 0x7f];
    pdVar5 = *(double **)pEVar4[bVar2].storage.data;
    lVar6 = (long)*(int *)(pdVar5 + 1);
    dVar1 = *(double *)(pEVar4[bVar2].storage.data + 8);
    if (lVar6 == -1) {
      local_40 = local_40 + dVar1 * *pdVar5;
    }
    else {
      this->matrix[lVar6] = dVar1 * (double)-factor;
    }
    QHashPrivate::iterator<QHashPrivate::Node<QSimplexVariable_*,_double>_>::operator++(&local_30);
  }
  solveMaxHelper(this);
  collectResults(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (double)factor * this->matrix[(long)this->columns + -1] + local_40;
  }
  __stack_chk_fail();
}

Assistant:

qreal QSimplex::solver(SolverFactor factor)
{
    // Remove old objective
    clearRow(0);

    // Set new objective in the first row of the simplex matrix
    qreal resultOffset = 0;
    for (auto iter = objective->variables.cbegin(); iter != objective->variables.cend(); ++iter) {

        // Check if the variable was removed in the simplification process.
        // If so, we save its offset to the objective function and skip adding
        // it to the matrix.
        if (iter.key()->index == -1) {
            resultOffset += iter.value() * iter.key()->result;
            continue;
        }

        setValueAt(0, iter.key()->index, -1 * factor * iter.value());
    }

    solveMaxHelper();
    collectResults();

#ifdef QT_DEBUG
    for (int i = 0; i < constraints.size(); ++i) {
        Q_ASSERT(constraints[i]->isSatisfied());
    }
#endif

    // Return the value calculated by the simplex plus the value of the
    // fixed variables.
    return (qToUnderlying(factor) * valueAt(0, columns - 1)) + resultOffset;
}